

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMockerBase<unsigned_char_(unsigned_short)>::InvokeWith
          (FunctionMockerBase<unsigned_char_(unsigned_short)> *this,type args)

{
  Result RVar1;
  UntypedActionResultHolderBase *pUVar2;
  long lVar3;
  bool bVar4;
  GTestLog local_14;
  
  pUVar2 = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,args)
  ;
  if (pUVar2 == (UntypedActionResultHolderBase *)0x0) {
    bVar4 = true;
  }
  else {
    lVar3 = __dynamic_cast(pUVar2,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<unsigned_char>::typeinfo,0);
    bVar4 = lVar3 != 0;
  }
  bVar4 = IsTrue(bVar4);
  if (!bVar4) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x5ea);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition f == NULL || dynamic_cast<To>(f) != NULL failed. ",
               0x3b);
    GTestLog::~GTestLog(&local_14);
  }
  RVar1 = *(Result *)&pUVar2[1]._vptr_UntypedActionResultHolderBase;
  if (pUVar2 != (UntypedActionResultHolderBase *)0x0) {
    bVar4 = IsTrue(true);
    if (bVar4) {
      (*pUVar2->_vptr_UntypedActionResultHolderBase[1])(pUVar2);
    }
  }
  return RVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    // const_cast is required since in C++98 we still pass ArgumentTuple around
    // by const& instead of rvalue reference.
    void* untyped_args = const_cast<void*>(static_cast<const void*>(&args));
    scoped_ptr<ResultHolder> holder(
        DownCast_<ResultHolder*>(this->UntypedInvokeWith(untyped_args)));
    return holder->Unwrap();
  }